

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::BitAndOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  ulong uVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t *puVar10;
  UnifiedVectorFormat idata;
  uhugeint_t local_90;
  Vector *local_80;
  uhugeint_t local_78;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar2 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar5 = 0;
      uVar7 = 0;
      local_80 = input;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar8 = uVar7 + 0x40;
          if (count <= uVar7 + 0x40) {
            uVar8 = count;
          }
LAB_004a248a:
          uVar9 = uVar7;
          if (uVar7 < uVar8) {
            puVar10 = (uint64_t *)(uVar7 * 0x10 + lVar2 + 8);
            do {
              local_78.lower = puVar10[-1];
              local_78.upper = *puVar10;
              if (*state == '\0') {
                *(uint64_t *)(state + 8) = local_78.lower;
                *(uint64_t *)(state + 0x10) = local_78.upper;
                *state = '\x01';
              }
              else {
                duckdb::uhugeint_t::operator&=((uhugeint_t *)(state + 8),&local_78);
              }
              uVar7 = uVar7 + 1;
              puVar10 = puVar10 + 2;
              uVar9 = uVar8;
            } while (uVar8 != uVar7);
          }
        }
        else {
          uVar1 = *(ulong *)(*(long *)(input + 0x28) + uVar5 * 8);
          uVar8 = uVar7 + 0x40;
          if (count <= uVar7 + 0x40) {
            uVar8 = count;
          }
          if (uVar1 == 0xffffffffffffffff) goto LAB_004a248a;
          uVar9 = uVar8;
          if ((uVar1 != 0) && (uVar9 = uVar7, uVar7 < uVar8)) {
            puVar10 = (uint64_t *)(uVar7 * 0x10 + lVar2 + 8);
            uVar6 = 0;
            do {
              if ((uVar1 >> (uVar6 & 0x3f) & 1) != 0) {
                local_78.lower = puVar10[-1];
                local_78.upper = *puVar10;
                if (*state == '\0') {
                  *(uint64_t *)(state + 8) = local_78.lower;
                  *(uint64_t *)(state + 0x10) = local_78.upper;
                  *state = '\x01';
                }
                else {
                  duckdb::uhugeint_t::operator&=((uhugeint_t *)(state + 8),&local_78);
                }
              }
              uVar6 = uVar6 + 1;
              puVar10 = puVar10 + 2;
              input = local_80;
              uVar9 = uVar8;
            } while (uVar8 - uVar7 != uVar6);
          }
        }
        uVar5 = uVar5 + 1;
        uVar7 = uVar9;
      } while (uVar5 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.lower = **(uint64_t **)(input + 0x20);
      local_78.upper = (*(uint64_t **)(input + 0x20))[1];
      if (*state == '\0') {
        *(uint64_t *)(state + 8) = local_78.lower;
        *(uint64_t *)(state + 0x10) = local_78.upper;
        *state = '\x01';
      }
      else {
        duckdb::uhugeint_t::operator&=((uhugeint_t *)(state + 8),&local_78);
      }
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_68 == 0) {
      if (count != 0) {
        lVar2 = *(long *)local_78.lower;
        uVar7 = 0;
        do {
          uVar5 = uVar7;
          if (lVar2 != 0) {
            uVar5 = (ulong)*(uint *)(lVar2 + uVar7 * 4);
          }
          uVar3 = *(uint64_t *)(local_78.upper + uVar5 * 0x10);
          uVar4 = *(uint64_t *)(local_78.upper + 8 + uVar5 * 0x10);
          if (*state == '\0') {
            *(uint64_t *)(state + 8) = uVar3;
            *(uint64_t *)(state + 0x10) = uVar4;
            *state = '\x01';
          }
          else {
            local_90.lower = uVar3;
            local_90.upper = uVar4;
            duckdb::uhugeint_t::operator&=((uhugeint_t *)(state + 8),&local_90);
          }
          uVar7 = uVar7 + 1;
        } while (count != uVar7);
      }
    }
    else if (count != 0) {
      lVar2 = *(long *)local_78.lower;
      uVar7 = 0;
      do {
        uVar5 = uVar7;
        if (lVar2 != 0) {
          uVar5 = (ulong)*(uint *)(lVar2 + uVar7 * 4);
        }
        if ((local_68 == 0) ||
           ((*(ulong *)(local_68 + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) != 0)) {
          uVar3 = *(uint64_t *)(local_78.upper + uVar5 * 0x10);
          uVar4 = *(uint64_t *)(local_78.upper + 8 + uVar5 * 0x10);
          if (*state == '\0') {
            *(uint64_t *)(state + 8) = uVar3;
            *(uint64_t *)(state + 0x10) = uVar4;
            *state = '\x01';
          }
          else {
            local_90.lower = uVar3;
            local_90.upper = uVar4;
            duckdb::uhugeint_t::operator&=((uhugeint_t *)(state + 8),&local_90);
          }
        }
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}